

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::ComputeFileNames(cmCTestLaunch *this)

{
  const_iterator cVar1;
  bool bVar2;
  uchar *puVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator ai;
  cmsysMD5 *md5;
  char hash [32];
  char *d;
  cmCTestLaunch *this_local;
  
  hash._24_8_ = getenv("CTEST_LAUNCH_LOGS");
  if (((char *)hash._24_8_ != (char *)0x0) && (*(char *)hash._24_8_ != '\0')) {
    this->Passthru = false;
    std::__cxx11::string::operator=((string *)&this->LogDir,(char *)hash._24_8_);
    cmsys::SystemTools::ConvertToUnixSlashes(&this->LogDir);
    std::__cxx11::string::operator+=((string *)&this->LogDir,"/");
    ai._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cmsysMD5_New();
    cmsysMD5_Initialize((cmsysMD5 *)ai._M_current);
    cVar1._M_current = ai._M_current;
    puVar3 = (uchar *)std::__cxx11::string::c_str();
    cmsysMD5_Append((cmsysMD5 *)cVar1._M_current,puVar3,-1);
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->RealArgs);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_48,&local_50);
    while( true ) {
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->RealArgs);
      bVar2 = __gnu_cxx::operator!=(&local_48,&local_58);
      cVar1 = ai;
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_48);
      puVar3 = (uchar *)std::__cxx11::string::c_str();
      cmsysMD5_Append((cmsysMD5 *)cVar1._M_current,puVar3,-1);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_48);
    }
    cmsysMD5_FinalizeHex((cmsysMD5 *)ai._M_current,(char *)&md5);
    cmsysMD5_Delete((cmsysMD5 *)ai._M_current);
    std::__cxx11::string::assign((char *)&this->LogHash,(ulong)&md5);
    std::__cxx11::string::operator=((string *)&this->LogOut,(string *)&this->LogDir);
    std::__cxx11::string::operator+=((string *)&this->LogOut,"launch-");
    std::__cxx11::string::operator+=((string *)&this->LogOut,(string *)&this->LogHash);
    std::__cxx11::string::operator+=((string *)&this->LogOut,"-out.txt");
    std::__cxx11::string::operator=((string *)&this->LogErr,(string *)&this->LogDir);
    std::__cxx11::string::operator+=((string *)&this->LogErr,"launch-");
    std::__cxx11::string::operator+=((string *)&this->LogErr,(string *)&this->LogHash);
    std::__cxx11::string::operator+=((string *)&this->LogErr,"-err.txt");
  }
  return;
}

Assistant:

void cmCTestLaunch::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  const char* d = getenv("CTEST_LAUNCH_LOGS");
  if(!(d && *d))
    {
    return;
    }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  char hash[32];
  cmsysMD5* md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5, (unsigned char const*)(this->CWD.c_str()), -1);
  for(std::vector<std::string>::const_iterator ai = this->RealArgs.begin();
      ai != this->RealArgs.end(); ++ai)
    {
    cmsysMD5_Append(md5, (unsigned char const*)ai->c_str(), -1);
    }
  cmsysMD5_FinalizeHex(md5, hash);
  cmsysMD5_Delete(md5);
  this->LogHash.assign(hash, 32);

  // We store stdout and stderr in temporary log files.
  this->LogOut = this->LogDir;
  this->LogOut += "launch-";
  this->LogOut += this->LogHash;
  this->LogOut += "-out.txt";
  this->LogErr = this->LogDir;
  this->LogErr += "launch-";
  this->LogErr += this->LogHash;
  this->LogErr += "-err.txt";
}